

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void __thiscall QTextCursor::mergeCharFormat(QTextCursor *this,QTextCharFormat *modifier)

{
  int iVar1;
  QTextCursorPrivate *pQVar2;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QTextCursorPrivate *)0x0) {
    pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    if (pQVar2->priv != (QTextDocumentPrivate *)0x0) {
      pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      iVar1 = pQVar2->position;
      pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      if (iVar1 != pQVar2->anchor) {
        pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QTextCursorPrivate::setCharFormat(pQVar2,modifier,MergeFormat);
          return;
        }
        goto LAB_0044dba6;
      }
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      charFormat((QTextCursor *)local_38);
      QTextFormat::merge((QTextFormat *)local_38,&modifier->super_QTextFormat);
      pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      iVar1 = QTextFormatCollection::indexForFormat(&pQVar2->priv->formats,(QTextFormat *)local_38);
      pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      pQVar2->currentCharFormat = iVar1;
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0044dba6:
  __stack_chk_fail();
}

Assistant:

void QTextCursor::mergeCharFormat(const QTextCharFormat &modifier)
{
    if (!d || !d->priv)
        return;
    if (d->position == d->anchor) {
        QTextCharFormat format = charFormat();
        format.merge(modifier);
        d->currentCharFormat = d->priv->formatCollection()->indexForFormat(format);
        return;
    }

    d->setCharFormat(modifier, QTextDocumentPrivate::MergeFormat);
}